

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csr.c
# Opt level: O0

int write_fcsr(CPURISCVState_conflict2 *env,int csrno,target_ulong val)

{
  _Bool _Var1;
  target_ulong val_local;
  int csrno_local;
  CPURISCVState_conflict2 *env_local;
  
  if (((env->debugger & 1U) == 0) &&
     (_Var1 = riscv_cpu_fp_enabled_riscv64((CPURISCVState_conflict1 *)env), !_Var1)) {
    return -1;
  }
  env->mstatus = env->mstatus | 0x6000;
  env->frm = (val & 0xe0) >> 5;
  riscv_cpu_set_fflags_riscv64(env,val & 0x1f);
  return 0;
}

Assistant:

static int write_fcsr(CPURISCVState *env, int csrno, target_ulong val)
{
    if (!env->debugger && !riscv_cpu_fp_enabled(env)) {
        return -1;
    }
    env->mstatus |= MSTATUS_FS;
    env->frm = (val & FSR_RD) >> FSR_RD_SHIFT;
    riscv_cpu_set_fflags(env, (val & FSR_AEXC) >> FSR_AEXC_SHIFT);
    return 0;
}